

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall Console::Prompt::Private::handleOutput(Private *this,int fd,int originalFd)

{
  usize *puVar1;
  code *pcVar2;
  int iVar3;
  usize size;
  char buffer [4096];
  String local_1040;
  byte local_1018 [4104];
  
  promptClear(this);
  restoreCursorPosition(this);
  restoreTerminalMode(this);
  size = read(fd,local_1018,0x1000);
  if (size == 0xffffffffffffffff) {
    iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                          ,0x3f3,"i != -1");
    size = 0xffffffffffffffff;
    if (iVar3 != 0) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  Buffer::append(&this->bufferedOutput,local_1018,size);
  flushConsole(this);
  enableTerminalRawMode(this);
  saveCursorPosition(this);
  local_1040.data = &String::emptyData.super_Data;
  promptWrite(this,0,&local_1040);
  if ((local_1040.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_1040.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_1040.data != (Data *)0x0)) {
      operator_delete__(local_1040.data);
    }
  }
  return;
}

Assistant:

void handleOutput(int fd, int originalFd)
#endif
  {
#ifdef _MSC_VER
    // get new output
    DWORD read;
    if(!GetOverlappedResult(hStdRead, &overlapped, &read, FALSE))
      return;
#endif

    // restore console
    promptClear();
    restoreCursorPosition();
    restoreTerminalMode();

    // add new output
#ifdef _MSC_VER
    DWORD written;
    VERIFY(WriteConsole(hOriginalStd, buffer, read / sizeof(char), &written, NULL));
    ASSERT(written == read / sizeof(char));
    while(ReadFile(hStdRead, buffer, (DWORD)bufferSize, &read, &overlapped))
    {
      VERIFY(WriteConsole(hOriginalStd, buffer, read / sizeof(char), &written, NULL));
      ASSERT(written == read / sizeof(char));
    }
#else
    char buffer[4096];
    ssize i = read(fd, buffer, sizeof(buffer));
    VERIFY(i != -1);
    writeConsole(buffer, i); // todo: write to originalFd and ensure utf8 sequences are valid
    flushConsole();
#endif

    // add prompt
    enableTerminalRawMode();
    saveCursorPosition();
    promptWrite();
  }